

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

ostream * docopt::operator<<(ostream *os,value *val)

{
  pointer pbVar1;
  bool bVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  pointer pbVar7;
  undefined8 uStack_38;
  
  poVar3 = os;
  uStack_38 = in_RAX;
  switch(val->kind_) {
  case Bool:
    value::throwIfNotKind(val,Bool);
    pcVar6 = "false";
    if ((ulong)(val->variant_).boolValue != 0) {
      pcVar6 = "true";
    }
    uVar5 = (ulong)(val->variant_).boolValue ^ 5;
    break;
  case Long:
    value::asLong(val);
    std::ostream::_M_insert<long>((long)os);
    return os;
  case String:
    value::throwIfNotKind(val,String);
    uStack_38._0_7_ = CONCAT16(0x22,(undefined6)uStack_38);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)(val->variant_).strList.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                        (val->variant_).strValue._M_string_length);
    pcVar6 = (char *)((long)&uStack_38 + 7);
    uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
    uVar5 = 1;
    break;
  case StringList:
    value::throwIfNotKind(val,StringList);
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    pbVar7 = (val->variant_).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pointer)(val->variant_).strValue._M_string_length;
    if (pbVar7 != pbVar1) {
      bVar2 = true;
      do {
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        uStack_38._0_5_ = CONCAT14(0x22,(undefined4)uStack_38);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(char *)((long)&uStack_38 + 4),1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        uStack_38._0_6_ = CONCAT15(0x22,(undefined5)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 5),1);
        pbVar7 = pbVar7 + 1;
        bVar2 = false;
      } while (pbVar7 != pbVar1);
    }
    pcVar6 = "]";
    uVar5 = 1;
    break;
  default:
    pcVar6 = "null";
    uVar5 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,uVar5);
  return os;
}

Assistant:

DOCOPT_INLINE
std::ostream& docopt::operator<<(std::ostream& os, value const& val)
{
	if (val.isBool()) {
		bool b = val.asBool();
		os << (b ? "true" : "false");
	} else if (val.isLong()) {
		long v = val.asLong();
		os << v;
	} else if (val.isString()) {
		std::string const& str = val.asString();
		os << '"' << str << '"';
	} else if (val.isStringList()) {
		auto const& list = val.asStringList();
		os << "[";
		bool first = true;
		for(auto const& el : list) {
			if (first) {
				first = false;
			} else {
				os << ", ";
			}
			os << '"' << el << '"';
		}
		os << "]";
	} else {
		os << "null";
	}
	return os;
}